

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildWithDepsLogTestObsoleteDeps::Run(BuildWithDepsLogTestObsoleteDeps *this)

{
  VirtualFileSystem *this_00;
  BuildConfig *config;
  int *piVar1;
  int iVar2;
  long lVar3;
  CommandRunner *pCVar4;
  Test *pTVar5;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar6;
  unique_ptr<CommandRunner,_std::default_delete<CommandRunner>_> uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  LoadStatus LVar11;
  Node *pNVar12;
  TimeStamp TVar13;
  string err;
  DepsLog deps_log;
  Builder builder;
  State state;
  allocator<char> local_2da;
  allocator<char> local_2d9;
  string local_2d8;
  string local_2b8;
  DepsLog local_298;
  BuildConfig *local_238;
  Builder local_230;
  string local_158;
  State local_138;
  
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"in1",(allocator<char> *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"",(allocator<char> *)&local_2d8);
  this_00 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,(string *)&local_138,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"in1.d",(allocator<char> *)&local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_230,"out: ",(allocator<char> *)&local_2d8);
  VirtualFileSystem::Create(this_00,(string *)&local_138,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_138);
  State::State(&local_138);
  iVar2 = g_current_test->assertion_failures_;
  StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&local_138);
  iVar10 = g_current_test->assertion_failures_;
  if (iVar2 == iVar10) {
    AssertParse(&local_138,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                (ManifestParserOptions)0x0);
    pTVar5 = g_current_test;
    iVar10 = g_current_test->assertion_failures_;
    if (iVar2 != iVar10) goto LAB_0012c1ef;
    local_298.file_path_._M_dataplus._M_p = (pointer)&local_298.file_path_.field_2;
    local_298.needs_recompaction_ = false;
    local_298.file_ = (FILE *)0x0;
    local_298.file_path_._M_string_length = 0;
    local_298.file_path_.field_2._M_local_buf[0] = '\0';
    local_298.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_298.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"ninja_deps",(allocator<char> *)&local_2d8);
    bVar8 = DepsLog::OpenForWrite(&local_298,(string *)&local_230,&local_2b8);
    bVar8 = testing::Test::Check
                      (pTVar5,bVar8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x890,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
    std::__cxx11::string::~string((string *)&local_230);
    pTVar5 = g_current_test;
    if (bVar8) {
      bVar8 = std::operator==("",&local_2b8);
      bVar8 = testing::Test::Check
                        (pTVar5,bVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x891,"\"\" == err");
      if (!bVar8) goto LAB_0012c1fe;
      config = &(this->super_BuildWithDepsLogTest).super_BuildTest.config_;
      Builder::Builder(&local_230,&local_138,config,(BuildLog *)0x0,&local_298,
                       &this_00->super_DiskInterface);
      uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
           &(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_;
      uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      if (local_230.command_runner_._M_t.
          super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
          super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
          super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
          (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
        pCVar4 = (CommandRunner *)
                 local_230.command_runner_._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        local_230.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
             _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
        (*pCVar4->_vptr_CommandRunner[1])();
        uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             local_230.command_runner_._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      }
      local_230.command_runner_._M_t.
      super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
      super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
      super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
           uVar7._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t
           .super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
           super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
      pTVar5 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,"out",(allocator<char> *)&local_158);
      local_238 = config;
      pNVar12 = Builder::AddTarget(&local_230,&local_2d8,&local_2b8);
      testing::Test::Check
                (pTVar5,pNVar12 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x895,"builder.AddTarget(\"out\", &err)");
      std::__cxx11::string::~string((string *)&local_2d8);
      pTVar5 = g_current_test;
      bVar8 = std::operator==("",&local_2b8);
      bVar8 = testing::Test::Check
                        (pTVar5,bVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x896,"\"\" == err");
      pTVar5 = g_current_test;
      if (bVar8) {
        bVar9 = Builder::Build(&local_230,&local_2b8);
        testing::Test::Check
                  (pTVar5,bVar9,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x897,"builder.Build(&err)");
        pTVar5 = g_current_test;
        bVar9 = std::operator==("",&local_2b8);
        testing::Test::Check
                  (pTVar5,bVar9,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0x898,"\"\" == err");
        DepsLog::Close(&local_298);
        local_230.command_runner_._M_t.
        super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
        super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
        super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
             (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
             (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
      }
      else {
        g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
      }
      Builder::~Builder(&local_230);
      DepsLog::~DepsLog(&local_298);
      State::~State(&local_138);
      if (!bVar8) goto LAB_0012c219;
      piVar1 = &(this->super_BuildWithDepsLogTest).super_BuildTest.fs_.now_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"in1",(allocator<char> *)&local_298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"",(allocator<char> *)&local_2d8);
      VirtualFileSystem::Create(this_00,(string *)&local_138,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"out",(allocator<char> *)&local_298);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"",(allocator<char> *)&local_2d8);
      VirtualFileSystem::Create(this_00,(string *)&local_138,(string *)&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_138);
      pTVar5 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"in1.d",(allocator<char> *)&local_230);
      TVar13 = VirtualFileSystem::Stat(this_00,(string *)&local_138,&local_2b8);
      testing::Test::Check
                (pTVar5,TVar13 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x8a5,"0 == fs_.Stat(\"in1.d\", &err)");
      std::__cxx11::string::~string((string *)&local_138);
      State::State(&local_138);
      iVar2 = g_current_test->assertion_failures_;
      StateTestWithBuiltinRules::AddCatRule((StateTestWithBuiltinRules *)this,&local_138);
      if (iVar2 == g_current_test->assertion_failures_) {
        AssertParse(&local_138,"build out: cat in1\n  deps = gcc\n  depfile = in1.d\n",
                    (ManifestParserOptions)0x0);
        pTVar5 = g_current_test;
        if (iVar2 != g_current_test->assertion_failures_) {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          goto LAB_0012c20c;
        }
        local_298.needs_recompaction_ = false;
        local_298.file_ = (FILE *)0x0;
        local_298.file_path_._M_dataplus._M_p = (pointer)&local_298.file_path_.field_2;
        local_298.file_path_._M_string_length = 0;
        local_298.file_path_.field_2._M_local_buf[0] = '\0';
        local_298.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.nodes_.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_298.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_298.deps_.super__Vector_base<DepsLog::Deps_*,_std::allocator<DepsLog::Deps_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_230,"ninja_deps",(allocator<char> *)&local_2d8);
        LVar11 = DepsLog::Load(&local_298,(string *)&local_230,&local_138,&local_2b8);
        bVar8 = testing::Test::Check
                          (pTVar5,LVar11 != LOAD_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0x8ad,"deps_log.Load(\"ninja_deps\", &state, &err)");
        std::__cxx11::string::~string((string *)&local_230);
        pTVar5 = g_current_test;
        if (bVar8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,"ninja_deps",(allocator<char> *)&local_2d8);
          bVar8 = DepsLog::OpenForWrite(&local_298,(string *)&local_230,&local_2b8);
          bVar8 = testing::Test::Check
                            (pTVar5,bVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                             ,0x8ae,"deps_log.OpenForWrite(\"ninja_deps\", &err)");
          std::__cxx11::string::~string((string *)&local_230);
          if (bVar8) {
            Builder::Builder(&local_230,&local_138,local_238,(BuildLog *)0x0,&local_298,
                             &this_00->super_DiskInterface);
            if ((__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)
                local_230.command_runner_._M_t.
                super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl !=
                (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0) {
              lVar3 = *(long *)local_230.command_runner_._M_t.
                               super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>
                               .super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              local_230.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   uVar6._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
              (**(code **)(lVar3 + 8))();
              uVar6._M_t.super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>.
              _M_t.super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   local_230.command_runner_._M_t.
                   super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                   super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                   super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            }
            local_230.command_runner_._M_t.
            super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
            super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
            super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                 uVar6._M_t.
                 super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
                 super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
                 super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear(&(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                     commands_ran_);
            pTVar5 = g_current_test;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2d8,"out",(allocator<char> *)&local_158);
            pNVar12 = Builder::AddTarget(&local_230,&local_2d8,&local_2b8);
            testing::Test::Check
                      (pTVar5,pNVar12 != (Node *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x8b3,"builder.AddTarget(\"out\", &err)");
            std::__cxx11::string::~string((string *)&local_2d8);
            pTVar5 = g_current_test;
            bVar8 = std::operator==("",&local_2b8);
            bVar8 = testing::Test::Check
                              (pTVar5,bVar8,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                               ,0x8b4,"\"\" == err");
            if (bVar8) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_2d8,"in1.d",&local_2d9);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_158,"out: ",&local_2da);
              VirtualFileSystem::Create(this_00,&local_2d8,&local_158);
              std::__cxx11::string::~string((string *)&local_158);
              std::__cxx11::string::~string((string *)&local_2d8);
              pTVar5 = g_current_test;
              bVar8 = Builder::Build(&local_230,&local_2b8);
              testing::Test::Check
                        (pTVar5,bVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8b9,"builder.Build(&err)");
              pTVar5 = g_current_test;
              bVar8 = std::operator==("",&local_2b8);
              testing::Test::Check
                        (pTVar5,bVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8ba,"\"\" == err");
              testing::Test::Check
                        (g_current_test,
                         (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_BuildWithDepsLogTest).super_BuildTest.command_runner_.
                               commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x8be,"1u == command_runner_.commands_ran_.size()");
              local_230.command_runner_._M_t.
              super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
              super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
              super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl =
                   (__uniq_ptr_data<CommandRunner,_std::default_delete<CommandRunner>,_true,_true>)
                   (__uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>)0x0;
            }
            else {
              g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
            }
            Builder::~Builder(&local_230);
          }
          else {
            g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
          }
        }
        else {
          g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
        }
        goto LAB_0012c202;
      }
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    }
    else {
LAB_0012c1fe:
      g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0012c202:
      DepsLog::~DepsLog(&local_298);
    }
  }
  else {
LAB_0012c1ef:
    g_current_test->assertion_failures_ = iVar10 + 1;
  }
LAB_0012c20c:
  State::~State(&local_138);
LAB_0012c219:
  std::__cxx11::string::~string((string *)&local_2b8);
  return;
}

Assistant:

TEST_F(BuildWithDepsLogTest, ObsoleteDeps) {
  string err;
  // Note: in1 was created by the superclass SetUp().
  const char* manifest =
      "build out: cat in1\n"
      "  deps = gcc\n"
      "  depfile = in1.d\n";
  {
    // Run an ordinary build that gathers dependencies.
    fs_.Create("in1", "");
    fs_.Create("in1.d", "out: ");

    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    // Run the build once, everything should be ok.
    DepsLog deps_log;
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));
    ASSERT_EQ("", err);

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);
    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    deps_log.Close();
    builder.command_runner_.release();
  }

  // Push all files one tick forward so that only the deps are out
  // of date.
  fs_.Tick();
  fs_.Create("in1", "");
  fs_.Create("out", "");

  // The deps file should have been removed, so no need to timestamp it.
  EXPECT_EQ(0, fs_.Stat("in1.d", &err));

  {
    State state;
    ASSERT_NO_FATAL_FAILURE(AddCatRule(&state));
    ASSERT_NO_FATAL_FAILURE(AssertParse(&state, manifest));

    DepsLog deps_log;
    ASSERT_TRUE(deps_log.Load("ninja_deps", &state, &err));
    ASSERT_TRUE(deps_log.OpenForWrite("ninja_deps", &err));

    Builder builder(&state, config_, NULL, &deps_log, &fs_);
    builder.command_runner_.reset(&command_runner_);
    command_runner_.commands_ran_.clear();
    EXPECT_TRUE(builder.AddTarget("out", &err));
    ASSERT_EQ("", err);

    // Recreate the deps file here because the build expects them to exist.
    fs_.Create("in1.d", "out: ");

    EXPECT_TRUE(builder.Build(&err));
    EXPECT_EQ("", err);

    // We should have rebuilt the output due to the deps being
    // out of date.
    EXPECT_EQ(1u, command_runner_.commands_ran_.size());

    builder.command_runner_.release();
  }
}